

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t get_path_component(char *name,size_t n,char *fn)

{
  char *pcVar1;
  ulong local_38;
  size_t l;
  char *p;
  char *fn_local;
  size_t n_local;
  char *name_local;
  
  pcVar1 = strchr(fn,0x2f);
  if (pcVar1 == (char *)0x0) {
    local_38 = strlen(fn);
    if (local_38 == 0) {
      return L'\0';
    }
  }
  else {
    local_38 = (long)pcVar1 - (long)fn;
  }
  if (n - 1 < local_38) {
    name_local._4_4_ = L'\xffffffff';
  }
  else {
    memcpy(name,fn,local_38);
    name[local_38] = '\0';
    name_local._4_4_ = (wchar_t)local_38;
  }
  return name_local._4_4_;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}